

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

unsigned_short capnp::(anonymous_namespace)::checkRoundTrip<unsigned_short,double>(double value)

{
  double in_XMM0_Qa;
  double dVar1;
  undefined1 local_10 [8];
  
  dVar1 = (double)((int)in_XMM0_Qa & 0xffff);
  if ((dVar1 != in_XMM0_Qa) || (NAN(dVar1) || NAN(in_XMM0_Qa))) {
    checkRoundTrip<unsigned_short,double>(local_10);
  }
  return (unsigned_short)(int)in_XMM0_Qa;
}

Assistant:

T checkRoundTrip(U value) {
#if __aarch64__
  // Work around an apparently broken compiler optimization on Clang / arm64. It appears that
  // for T = int8_t, U = double, and value = 128, the compiler incorrectly believes that the
  // round-trip does not change the value, where in fact it should change to -128. Similar problems
  // exist for various other types and inputs -- json-test seems to exercise several problem cases.
  // The problem only exists when compiling with optimization. In any case, declaring the variable
  // `volatile` kills the optimization.
  volatile
#endif
  T result = value;
  KJ_REQUIRE(U(result) == value, "Value out-of-range for requested type.", value) {
    // Use it anyway.
    break;
  }
  return result;
}